

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.cpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
DummyClass<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::fun
          (DummyClass<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *res,int t)

{
  _List_node_base *p_Var1;
  string local_48;
  
  this->call = this->call + 1;
  this->timedata = t;
  for (p_Var1 = (this->inputsig).
                super__List_base<dynamicgraph::SignalTimeDependent<double,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<double,_int>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->inputsig; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x20))(p_Var1[1]._M_next,&this->timedata);
  }
  for (p_Var1 = (this->inputsigV).
                super__List_base<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->inputsigV; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x20))(p_Var1[1]._M_next,&this->timedata);
  }
  operator()(&local_48,this);
  std::__cxx11::string::operator=((string *)res,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return res;
}

Assistant:

T &fun(T &res, int t) {
    ++call;
    timedata = t;

    BOOST_FOREACH (sigDouble_t *ptr, inputsig) ptr->access(timedata);

    BOOST_FOREACH (sigString_t *ptr, inputsigV) ptr->access(timedata);

    res = (*this)();
    return res;
  }